

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void encode_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
              int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PC_TREE *pc_tree,int *rate)

{
  MACROBLOCKD *xd;
  byte bVar1;
  byte partition;
  BLOCK_SIZE bsize_00;
  BLOCK_SIZE bsize_01;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int *rate_00;
  long lVar8;
  PARTITION_TYPE partition_00;
  int *rate_01;
  PICK_MODE_CONTEXT *ctx;
  
  rate_00 = (int *)(ulong)(uint)mi_row;
  xd = &(td->mb).e_mbd;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  if ((ulong)bsize < 3) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = partition_plane_context(xd,mi_row,mi_col,bsize);
  }
  partition = pc_tree->partitioning;
  bsize_00 = get_partition_subsize(bsize,partition);
  bsize_01 = get_partition_subsize(bsize,'\x03');
  iVar3 = (cpi->common).mi_params.mi_rows;
  if ((iVar3 <= mi_row) ||
     (iVar5 = (cpi->common).mi_params.mi_cols, bsize_00 == BLOCK_INVALID || iVar5 <= mi_col)) {
    return;
  }
  uVar6 = (uint)(bVar1 >> 1);
  rate_01 = (int *)&DAT_00000004;
  if (((-1 < (int)uVar2 && dry_run == '\0') &&
      ((int)(mi_col + uVar6) < iVar5 && (int)(uVar6 + mi_row) < iVar3)) &&
     (tile_data->allow_update_cdf != '\0')) {
    iVar3 = (bsize != BLOCK_128X128) + 8 + (uint)(bsize != BLOCK_128X128);
    if (bsize < BLOCK_8X16) {
      iVar3 = 4;
    }
    rate_01 = (int *)0x1c6bb1;
    update_cdf(((td->mb).e_mbd.tile_ctx)->partition_cdf[uVar2],partition,iVar3);
  }
  iVar3 = (int)rate_00;
  iVar5 = iVar3;
  if (9 < partition) goto LAB_001c7167;
  bVar1 = bVar1 >> 2;
  iVar7 = mi_col;
  switch(partition) {
  case 0:
    ctx = pc_tree->none;
    partition_00 = '\0';
    bsize_01 = bsize_00;
    break;
  case 1:
    encode_b(cpi,tile_data,td,tp,iVar3,mi_col,dry_run,bsize_00,'\x01',pc_tree->horizontal[0],rate_00
            );
    iVar5 = (int)rate_00;
    iVar3 = uVar6 + iVar5;
    if ((cpi->common).mi_params.mi_rows <= iVar3) goto LAB_001c7167;
    ctx = pc_tree->horizontal[1];
    partition_00 = '\x01';
    bsize_01 = bsize_00;
    break;
  case 2:
    encode_b(cpi,tile_data,td,tp,iVar3,mi_col,dry_run,bsize_00,'\x02',pc_tree->vertical[0],rate_00);
    iVar3 = (int)rate_00;
    iVar5 = iVar3;
    if ((cpi->common).mi_params.mi_cols <= (int)(uVar6 + mi_col)) goto LAB_001c7167;
    ctx = pc_tree->vertical[1];
    partition_00 = '\x02';
    iVar7 = uVar6 + mi_col;
    bsize_01 = bsize_00;
    break;
  case 3:
    encode_sb(cpi,td,tile_data,tp,iVar3,mi_col,dry_run,bsize_00,pc_tree->split[0],rate_01);
    iVar5 = (int)rate_00;
    encode_sb(cpi,td,tile_data,tp,iVar5,uVar6 + mi_col,dry_run,bsize_00,pc_tree->split[1],rate_01);
    iVar3 = uVar6 + iVar5;
    encode_sb(cpi,td,tile_data,tp,iVar3,mi_col,dry_run,bsize_00,pc_tree->split[2],rate_01);
    encode_sb(cpi,td,tile_data,tp,iVar3,uVar6 + mi_col,dry_run,bsize_00,pc_tree->split[3],rate_01);
    goto LAB_001c7167;
  case 4:
    encode_b(cpi,tile_data,td,tp,iVar3,mi_col,dry_run,bsize_01,'\x04',pc_tree->horizontala[0],
             rate_00);
    encode_b(cpi,tile_data,td,tp,(int)rate_00,uVar6 + mi_col,dry_run,bsize_01,'\x04',
             pc_tree->horizontala[1],rate_00);
    iVar3 = uVar6 + (int)rate_00;
    ctx = pc_tree->horizontala[2];
    partition_00 = '\x04';
    bsize_01 = bsize_00;
    break;
  case 5:
    encode_b(cpi,tile_data,td,tp,iVar3,mi_col,dry_run,bsize_00,'\x05',pc_tree->horizontalb[0],
             rate_00);
    iVar3 = uVar6 + (int)rate_00;
    encode_b(cpi,tile_data,td,tp,iVar3,mi_col,dry_run,bsize_01,'\x05',pc_tree->horizontalb[1],
             rate_00);
    ctx = pc_tree->horizontalb[2];
    partition_00 = '\x05';
    iVar7 = uVar6 + mi_col;
    break;
  case 6:
    encode_b(cpi,tile_data,td,tp,iVar3,mi_col,dry_run,bsize_01,'\x06',pc_tree->verticala[0],rate_00)
    ;
    encode_b(cpi,tile_data,td,tp,uVar6 + (int)rate_00,mi_col,dry_run,bsize_01,'\x06',
             pc_tree->verticala[1],rate_00);
    iVar3 = (int)rate_00;
    ctx = pc_tree->verticala[2];
    partition_00 = '\x06';
    iVar7 = uVar6 + mi_col;
    bsize_01 = bsize_00;
    break;
  case 7:
    encode_b(cpi,tile_data,td,tp,iVar3,mi_col,dry_run,bsize_00,'\a',pc_tree->verticalb[0],rate_00);
    encode_b(cpi,tile_data,td,tp,(int)rate_00,uVar6 + mi_col,dry_run,bsize_01,'\a',
             pc_tree->verticalb[1],rate_00);
    iVar3 = uVar6 + (int)rate_00;
    ctx = pc_tree->verticalb[2];
    partition_00 = '\a';
    iVar7 = uVar6 + mi_col;
    break;
  case 8:
    lVar8 = 0;
    for (lVar4 = (long)iVar3;
        (iVar5 = (int)rate_00, lVar8 != 4 &&
        ((lVar8 == 0 || (lVar4 < (cpi->common).mi_params.mi_rows)))); lVar4 = lVar4 + (ulong)bVar1)
    {
      encode_b(cpi,tile_data,td,tp,(int)lVar4,mi_col,dry_run,bsize_00,'\b',
               pc_tree->horizontal4[lVar8],rate_00);
      lVar8 = lVar8 + 1;
    }
    goto LAB_001c7167;
  case 9:
    lVar8 = 0;
    for (lVar4 = (long)mi_col;
        (iVar5 = (int)rate_00, lVar8 != 4 &&
        ((lVar8 == 0 || (lVar4 < (cpi->common).mi_params.mi_cols)))); lVar4 = lVar4 + (ulong)bVar1)
    {
      encode_b(cpi,tile_data,td,tp,iVar5,(int)lVar4,dry_run,bsize_00,'\t',pc_tree->vertical4[lVar8],
               rate_00);
      lVar8 = lVar8 + 1;
    }
    goto LAB_001c7167;
  }
  encode_b(cpi,tile_data,td,tp,iVar3,iVar7,dry_run,bsize_01,partition_00,ctx,rate_00);
  iVar5 = (int)rate_00;
LAB_001c7167:
  update_ext_partition_context(xd,iVar5,mi_col,bsize_00,bsize,partition);
  return;
}

Assistant:

static void encode_sb(const AV1_COMP *const cpi, ThreadData *td,
                      TileDataEnc *tile_data, TokenExtra **tp, int mi_row,
                      int mi_col, RUN_TYPE dry_run, BLOCK_SIZE bsize,
                      PC_TREE *pc_tree, int *rate) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int hbs = mi_size_wide[bsize] / 2;
  const int is_partition_root = bsize >= BLOCK_8X8;
  const int ctx = is_partition_root
                      ? partition_plane_context(xd, mi_row, mi_col, bsize)
                      : -1;
  const PARTITION_TYPE partition = pc_tree->partitioning;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
#if !CONFIG_REALTIME_ONLY
  int quarter_step = mi_size_wide[bsize] / 4;
  int i;
  BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
#endif

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;
  if (subsize == BLOCK_INVALID) return;

  if (!dry_run && ctx >= 0) {
    const int has_rows = (mi_row + hbs) < mi_params->mi_rows;
    const int has_cols = (mi_col + hbs) < mi_params->mi_cols;

    if (has_rows && has_cols) {
#if CONFIG_ENTROPY_STATS
      td->counts->partition[ctx][partition]++;
#endif

      if (tile_data->allow_update_cdf) {
        FRAME_CONTEXT *fc = xd->tile_ctx;
        update_cdf(fc->partition_cdf[ctx], partition,
                   partition_cdf_length(bsize));
      }
    }
  }

  switch (partition) {
    case PARTITION_NONE:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->none, rate);
      break;
    case PARTITION_VERT:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->vertical[0], rate);
      if (mi_col + hbs < mi_params->mi_cols) {
        encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, subsize,
                 partition, pc_tree->vertical[1], rate);
      }
      break;
    case PARTITION_HORZ:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->horizontal[0], rate);
      if (mi_row + hbs < mi_params->mi_rows) {
        encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, subsize,
                 partition, pc_tree->horizontal[1], rate);
      }
      break;
    case PARTITION_SPLIT:
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, dry_run, subsize,
                pc_tree->split[0], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col + hbs, dry_run, subsize,
                pc_tree->split[1], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row + hbs, mi_col, dry_run, subsize,
                pc_tree->split[2], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row + hbs, mi_col + hbs, dry_run,
                subsize, pc_tree->split[3], rate);
      break;

#if !CONFIG_REALTIME_ONLY
    case PARTITION_HORZ_A:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, bsize2,
               partition, pc_tree->horizontala[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, bsize2,
               partition, pc_tree->horizontala[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, subsize,
               partition, pc_tree->horizontala[2], rate);
      break;
    case PARTITION_HORZ_B:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->horizontalb[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, bsize2,
               partition, pc_tree->horizontalb[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col + hbs, dry_run,
               bsize2, partition, pc_tree->horizontalb[2], rate);
      break;
    case PARTITION_VERT_A:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, bsize2,
               partition, pc_tree->verticala[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, bsize2,
               partition, pc_tree->verticala[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, subsize,
               partition, pc_tree->verticala[2], rate);

      break;
    case PARTITION_VERT_B:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->verticalb[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, bsize2,
               partition, pc_tree->verticalb[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col + hbs, dry_run,
               bsize2, partition, pc_tree->verticalb[2], rate);
      break;
    case PARTITION_HORZ_4:
      for (i = 0; i < SUB_PARTITIONS_PART4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= mi_params->mi_rows) break;

        encode_b(cpi, tile_data, td, tp, this_mi_row, mi_col, dry_run, subsize,
                 partition, pc_tree->horizontal4[i], rate);
      }
      break;
    case PARTITION_VERT_4:
      for (i = 0; i < SUB_PARTITIONS_PART4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= mi_params->mi_cols) break;
        encode_b(cpi, tile_data, td, tp, mi_row, this_mi_col, dry_run, subsize,
                 partition, pc_tree->vertical4[i], rate);
      }
      break;
#endif
    default: assert(0 && "Invalid partition type."); break;
  }

  update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}